

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O1

size_t FileStream_Prefix(TCHAR *szFileName,DWORD *pdwProvider)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  DWORD DVar4;
  ulong uVar5;
  char *__s1;
  
  DVar4 = 0;
  if (szFileName == (TCHAR *)0x0) {
    return 0;
  }
  uVar5 = 5;
  iVar2 = strncasecmp(szFileName,"flat-",5);
  lVar3 = 5;
  if (iVar2 != 0) {
    iVar2 = strncasecmp(szFileName,"part-",5);
    if (iVar2 == 0) {
      DVar4 = 0x10;
    }
    else {
      lVar3 = 5;
      iVar2 = strncasecmp(szFileName,"mpqe-",5);
      if (iVar2 == 0) {
        DVar4 = 0x20;
      }
      else {
        iVar2 = strncasecmp(szFileName,"blk4-",5);
        lVar3 = (ulong)(iVar2 == 0) * 5;
        DVar4 = 0x30;
        if (iVar2 != 0) {
          DVar4 = 0;
        }
      }
    }
  }
  __s1 = szFileName + lVar3;
  iVar2 = strncasecmp(__s1,"file:",5);
  if (iVar2 != 0) {
    uVar5 = 4;
    iVar2 = strncasecmp(__s1,"map:",4);
    if (iVar2 == 0) {
      DVar4 = DVar4 | 1;
    }
    else {
      uVar5 = 5;
      iVar2 = strncasecmp(__s1,"http:",5);
      if (iVar2 != 0) {
        bVar1 = true;
        uVar5 = 0;
        goto LAB_0010cfcd;
      }
      DVar4 = DVar4 | 2;
    }
  }
  bVar1 = false;
LAB_0010cfcd:
  if (bVar1) {
    return 0;
  }
  if ((__s1[uVar5] == '/') && (__s1[uVar5 + 1] == '/')) {
    uVar5 = uVar5 | 2;
  }
  if (pdwProvider != (DWORD *)0x0) {
    *pdwProvider = DVar4;
  }
  return uVar5 + lVar3;
}

Assistant:

size_t FileStream_Prefix(const TCHAR * szFileName, DWORD * pdwProvider)
{
    size_t nPrefixLength1 = 0;
    size_t nPrefixLength2 = 0;
    DWORD dwProvider = 0;

    if(szFileName != NULL)
    {
        //
        // Determine the stream provider
        //

        if(!_tcsnicmp(szFileName, _T("flat-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_FLAT;
            nPrefixLength1 = 5;
        }

        else if(!_tcsnicmp(szFileName, _T("part-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_PARTIAL;
            nPrefixLength1 = 5;
        }

        else if(!_tcsnicmp(szFileName, _T("mpqe-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_ENCRYPTED;
            nPrefixLength1 = 5;
        }

        else if(!_tcsnicmp(szFileName, _T("blk4-"), 5))
        {
            dwProvider |= STREAM_PROVIDER_BLOCK4;
            nPrefixLength1 = 5;
        }

        //
        // Determine the base provider
        //

        if(!_tcsnicmp(szFileName+nPrefixLength1, _T("file:"), 5))
        {
            dwProvider |= BASE_PROVIDER_FILE;
            nPrefixLength2 = 5;
        }

        else if(!_tcsnicmp(szFileName+nPrefixLength1, _T("map:"), 4))
        {
            dwProvider |= BASE_PROVIDER_MAP;
            nPrefixLength2 = 4;
        }

        else if(!_tcsnicmp(szFileName+nPrefixLength1, _T("http:"), 5))
        {
            dwProvider |= BASE_PROVIDER_HTTP;
            nPrefixLength2 = 5;
        }

        // Only accept stream provider if we recognized the base provider
        if(nPrefixLength2 != 0)
        {
            // It is also allowed to put "//" after the base provider, e.g. "file://", "http://"
            if(szFileName[nPrefixLength1+nPrefixLength2] == '/' && szFileName[nPrefixLength1+nPrefixLength2+1] == '/')
                nPrefixLength2 += 2;

            if(pdwProvider != NULL)
                *pdwProvider = dwProvider;
            return nPrefixLength1 + nPrefixLength2;
        }
    }

    return 0;
}